

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *
testing::internal::ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>>::
PerformAction<std::experimental::fundamentals_v1::optional<InotifyEvent>()>
          (Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()> *action,
          ArgumentTuple *args)

{
  ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 local_80 [40];
  char local_58;
  size_type local_38;
  undefined8 uStack_30;
  
  pAVar1 = (ActionResultHolder<std::experimental::fundamentals_v1::optional<InotifyEvent>_> *)
           operator_new(0x38);
  Action<std::experimental::fundamentals_v1::optional<InotifyEvent>_()>::Perform
            ((Result *)
             &((anon_union_40_2_e8b08be2_for__Optional_base<InotifyEvent,_true>_2 *)local_80)->
              _M_payload,action,args);
  if (local_58 == '\x01') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&(((anon_union_40_2_e8b08be2_for__Optional_base<InotifyEvent,_true>_2 *)local_80)
                   ->_M_payload).path + 0x10U)) {
      uStack_30 = local_80._32_8_;
      local_80._8_8_ = &local_38;
    }
    local_38 = CONCAT71(local_80._25_7_,local_80[0x18]);
    (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
         (_func_int **)&PTR__ActionResultHolder_001acb88;
    (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>._M_engaged = false;
    (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.type =
         local_80._0_4_;
    paVar2 = &(pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.
              path.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&(pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0 + 8) =
         paVar2;
    if ((size_type *)local_80._8_8_ == &local_38) {
      paVar2->_M_allocated_capacity = local_38;
      *(undefined8 *)
       ((long)&(pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.
               path.field_2 + 8) = uStack_30;
    }
    else {
      (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.path.
      _M_dataplus._M_p = (pointer)local_80._8_8_;
      (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.path.
      field_2._M_allocated_capacity = local_38;
    }
    (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>.field_0._M_payload.path.
    _M_string_length = local_80._16_8_;
    (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>._M_engaged = true;
  }
  else {
    (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
         (_func_int **)&PTR__ActionResultHolder_001acb88;
    (pAVar1->result_).value_.super__Optional_base<InotifyEvent,_true>._M_engaged = false;
  }
  return pAVar1;
}

Assistant:

static ActionResultHolder*
  PerformAction(const Action<F>& action,
                const typename Function<F>::ArgumentTuple& args) {
    return new ActionResultHolder(Wrapper(action.Perform(args)));
  }